

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

int arangodb::velocypack::Collection::remove(char *__filename)

{
  _Alloc_hider _Var1;
  const_iterator cVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *in_RDX;
  int __fd;
  Slice in_RSI;
  string *psVar3;
  ulong uVar5;
  string_view attrName;
  string key;
  ObjectIterator it;
  Slice local_78;
  string local_70;
  ObjectIterator local_50;
  size_type sVar4;
  
  Builder::Builder((Builder *)__filename);
  Value::Value((Value *)&local_50,Object,false);
  Builder::addInternal<arangodb::velocypack::Value>((Builder *)__filename,(Value *)&local_50);
  ObjectIterator::ObjectIterator(&local_50,in_RSI,false);
  __fd = (int)in_RSI._start;
  if (local_50._position != local_50._size) {
    do {
      local_78 = ObjectIterator::key(&local_50,true);
      SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
                (&local_70,
                 (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_78);
      psVar3 = &local_70;
      cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(in_RDX,&local_70);
      sVar4 = local_70._M_string_length;
      _Var1._M_p = local_70._M_dataplus._M_p;
      __fd = (int)psVar3;
      if (cVar2.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_78 = ObjectIterator::value(&local_50);
        attrName._M_str = _Var1._M_p;
        attrName._M_len = sVar4;
        Builder::addInternal<arangodb::velocypack::Slice>((Builder *)__filename,attrName,&local_78);
        __fd = (int)sVar4;
      }
      ObjectIterator::next(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar5 = local_70.field_2._M_allocated_capacity + 1;
        operator_delete(local_70._M_dataplus._M_p,uVar5);
        __fd = (int)uVar5;
      }
    } while (local_50._position != local_50._size);
  }
  Builder::close((Builder *)__filename,__fd);
  return (int)__filename;
}

Assistant:

Builder Collection::remove(Slice slice,
                           std::unordered_set<std::string> const& keys) {
  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (keys.find(key) == keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}